

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O3

mz_bool mz_zip_writer_add_from_zip_reader
                  (mz_zip_archive *pZip,mz_zip_archive *pSource_zip,mz_uint file_index)

{
  mz_uint mVar1;
  uint uVar2;
  mz_zip_internal_state *pArray;
  mz_zip_internal_state *pmVar3;
  mz_bool mVar4;
  size_t sVar5;
  mz_uint64 mVar6;
  size_t sVar7;
  ulong uVar8;
  int *piVar9;
  void *pvVar10;
  uint uVar11;
  size_t __n;
  long lVar12;
  mz_uint64 mVar13;
  size_t orig_size;
  mz_uint64 mVar14;
  ulong uVar15;
  mz_uint32 local_header_u32 [8];
  mz_uint8 central_header [46];
  uint local_1074;
  undefined8 *local_1070;
  int *local_1068;
  mz_uint64 local_1060;
  int local_1058;
  byte local_1052;
  ushort local_103e;
  ushort local_103c;
  undefined8 local_1038;
  undefined8 uStack_1030;
  undefined8 uStack_1028;
  undefined6 uStack_1020;
  undefined2 local_101a;
  undefined6 uStack_1018;
  undefined8 uStack_1012;
  
  if (pZip == (mz_zip_archive *)0x0) {
    return 0;
  }
  pArray = pZip->m_pState;
  if (pArray == (mz_zip_internal_state *)0x0) {
    return 0;
  }
  if (pSource_zip == (mz_zip_archive *)0x0) {
    return 0;
  }
  if (pZip->m_zip_mode != MZ_ZIP_MODE_WRITING) {
    return 0;
  }
  pmVar3 = pSource_zip->m_pState;
  if (pmVar3 == (mz_zip_internal_state *)0x0) {
    return 0;
  }
  if (pSource_zip->m_total_files <= file_index) {
    return 0;
  }
  if (pSource_zip->m_zip_mode != MZ_ZIP_MODE_READING) {
    return 0;
  }
  pvVar10 = (pmVar3->m_central_dir).m_p;
  if (pvVar10 == (void *)0x0) {
    return 0;
  }
  mVar1 = pZip->m_file_offset_alignment;
  uVar11 = 0;
  if (mVar1 != 0) {
    uVar11 = mVar1 - ((uint)pZip->m_archive_size & mVar1 - 1) & mVar1 - 1;
  }
  if (pZip->m_total_files == 0xffff) {
    return 0;
  }
  mVar14 = pZip->m_archive_size;
  local_1060 = uVar11 + mVar14;
  if (local_1060 - 0xffffffb4 < 0xffffffff00000000) {
    return 0;
  }
  local_1070 = (undefined8 *)
               ((long)pvVar10 +
               (ulong)*(uint *)((long)(pmVar3->m_central_dir_offsets).m_p + (ulong)file_index * 4));
  uVar2 = *(uint *)((long)local_1070 + 0x2a);
  sVar5 = (*pSource_zip->m_pRead)(pSource_zip->m_pIO_opaque,(ulong)uVar2,&local_1058,0x1e);
  if (sVar5 != 0x1e) {
    return 0;
  }
  if (local_1058 != 0x4034b50) {
    return 0;
  }
  mVar6 = uVar11 + mVar14 + 0x1e;
  mVar13 = (ulong)uVar2 + 0x1e;
  __n = 0x1000;
  if (uVar11 < 0x1000) {
    __n = (size_t)uVar11;
  }
  memset(&local_1038,0,__n);
  while (uVar11 != 0) {
    sVar5 = 0x1000;
    if (uVar11 < 0x1000) {
      sVar5 = (size_t)uVar11;
    }
    sVar7 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,mVar14,&local_1038,sVar5);
    mVar14 = mVar14 + sVar5;
    uVar11 = uVar11 - (int)sVar5;
    if (sVar7 != sVar5) {
      return 0;
    }
  }
  sVar5 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,local_1060,&local_1058,0x1e);
  if (sVar5 != 0x1e) {
    return 0;
  }
  uVar15 = (ulong)((uint)local_103c + (uint)local_103e + *(int *)((long)local_1070 + 0x14));
  uVar8 = 0x10000;
  if (uVar15 < 0x10000) {
    uVar8 = uVar15;
  }
  sVar5 = 0x10;
  if (0x10 < uVar8) {
    sVar5 = uVar8;
  }
  piVar9 = (int *)(*pZip->m_pAlloc)(pZip->m_pAlloc_opaque,1,sVar5);
  if (piVar9 == (int *)0x0) {
    return 0;
  }
  for (; uVar15 != 0; uVar15 = uVar15 - sVar5) {
    sVar5 = 0x10000;
    if (uVar15 < 0x10000) {
      sVar5 = uVar15;
    }
    local_1068 = piVar9;
    sVar7 = (*pSource_zip->m_pRead)(pSource_zip->m_pIO_opaque,mVar13,piVar9,sVar5);
    if (sVar7 != sVar5) goto LAB_0012489d;
    sVar7 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,mVar6,piVar9,sVar5);
    piVar9 = local_1068;
    if (sVar7 != sVar5) {
      pvVar10 = pZip->m_pAlloc_opaque;
      goto LAB_001248b8;
    }
    mVar13 = mVar13 + sVar5;
    mVar6 = mVar6 + sVar5;
  }
  if ((local_1052 & 8) == 0) {
LAB_001246b9:
    (*pZip->m_pFree)(pZip->m_pAlloc_opaque,piVar9);
    if (mVar6 >> 0x20 == 0) {
      uVar8 = (pArray->m_central_dir).m_size;
      local_1038 = *local_1070;
      uStack_1030 = local_1070[1];
      uStack_1028 = local_1070[2];
      uStack_1018 = (undefined6)((ulong)*(undefined8 *)((long)local_1070 + 0x1e) >> 0x10);
      uStack_1020 = (undefined6)local_1070[3];
      local_101a = (undefined2)((ulong)local_1070[3] >> 0x30);
      uStack_1012 = CONCAT44((int)local_1060,(int)*(undefined8 *)((long)local_1070 + 0x26));
      uVar15 = uVar8 + 0x2e;
      if ((uVar15 <= (pArray->m_central_dir).m_capacity) ||
         (mVar4 = tinyexr::miniz::mz_zip_array_ensure_capacity(pZip,&pArray->m_central_dir,uVar15,1)
         , mVar4 != 0)) {
        (pArray->m_central_dir).m_size = uVar15;
        uVar15 = (ulong)(pArray->m_central_dir).m_element_size;
        memcpy((void *)(uVar8 * uVar15 + (long)(pArray->m_central_dir).m_p),&local_1038,
               uVar15 * 0x2e);
        lVar12 = (ulong)*(ushort *)(local_1070 + 4) +
                 (ulong)*(ushort *)((long)local_1070 + 0x1e) +
                 (ulong)*(ushort *)((long)local_1070 + 0x1c);
        sVar5 = (pArray->m_central_dir).m_size;
        uVar15 = sVar5 + lVar12;
        if (((pArray->m_central_dir).m_capacity < uVar15) &&
           (mVar4 = tinyexr::miniz::mz_zip_array_ensure_capacity
                              (pZip,&pArray->m_central_dir,uVar15,1), mVar4 == 0)) {
          uVar15 = (pArray->m_central_dir).m_capacity;
        }
        else {
          (pArray->m_central_dir).m_size = uVar15;
          uVar15 = (ulong)(pArray->m_central_dir).m_element_size;
          memcpy((void *)(sVar5 * uVar15 + (long)(pArray->m_central_dir).m_p),
                 (void *)((long)local_1070 + 0x2e),lVar12 * uVar15);
          if (*(int *)((long)&(pArray->m_central_dir).m_size + 4) != 0) {
            return 0;
          }
          local_1074 = (uint)uVar8;
          sVar5 = (pArray->m_central_dir_offsets).m_size;
          uVar15 = sVar5 + 1;
          if ((uVar15 <= (pArray->m_central_dir_offsets).m_capacity) ||
             (mVar4 = tinyexr::miniz::mz_zip_array_ensure_capacity
                                (pZip,&pArray->m_central_dir_offsets,uVar15,1), mVar4 != 0)) {
            (pArray->m_central_dir_offsets).m_size = uVar15;
            uVar15 = (ulong)(pArray->m_central_dir_offsets).m_element_size;
            memcpy((void *)(sVar5 * uVar15 + (long)(pArray->m_central_dir_offsets).m_p),&local_1074,
                   uVar15);
            pZip->m_total_files = pZip->m_total_files + 1;
            pZip->m_archive_size = mVar6;
            return 1;
          }
          uVar15 = (pArray->m_central_dir).m_capacity;
        }
        if (uVar15 < uVar8) {
          pvVar10 = (*pZip->m_pRealloc)(pZip->m_pAlloc_opaque,(pArray->m_central_dir).m_p,
                                        (size_t)(pArray->m_central_dir).m_element_size,uVar8);
          if (pvVar10 == (void *)0x0) {
            return 0;
          }
          (pArray->m_central_dir).m_p = pvVar10;
          (pArray->m_central_dir).m_capacity = uVar8;
        }
        (pArray->m_central_dir).m_size = uVar8;
      }
    }
  }
  else {
    sVar5 = (*pSource_zip->m_pRead)(pSource_zip->m_pIO_opaque,mVar13,piVar9,0x10);
    if (sVar5 == 0x10) {
      local_1074 = (uint)(*piVar9 == 0x8074b50) * 4 + 0xc;
      uVar15 = (ulong)local_1074;
      sVar5 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,mVar6,piVar9,uVar15);
      if (sVar5 == uVar15) {
        mVar6 = mVar6 + uVar15;
        goto LAB_001246b9;
      }
      pvVar10 = pZip->m_pAlloc_opaque;
    }
    else {
LAB_0012489d:
      pvVar10 = pZip->m_pAlloc_opaque;
    }
LAB_001248b8:
    (*pZip->m_pFree)(pvVar10,piVar9);
  }
  return 0;
}

Assistant:

mz_bool mz_zip_writer_add_from_zip_reader(mz_zip_archive *pZip,
                                          mz_zip_archive *pSource_zip,
                                          mz_uint file_index) {
  mz_uint n, bit_flags, num_alignment_padding_bytes;
  mz_uint64 comp_bytes_remaining, local_dir_header_ofs;
  mz_uint64 cur_src_file_ofs, cur_dst_file_ofs;
  mz_uint32
      local_header_u32[(MZ_ZIP_LOCAL_DIR_HEADER_SIZE + sizeof(mz_uint32) - 1) /
                       sizeof(mz_uint32)];
  mz_uint8 *pLocal_header = (mz_uint8 *)local_header_u32;
  mz_uint8 central_header[MZ_ZIP_CENTRAL_DIR_HEADER_SIZE];
  size_t orig_central_dir_size;
  mz_zip_internal_state *pState;
  void *pBuf;
  const mz_uint8 *pSrc_central_header;

  if ((!pZip) || (!pZip->m_pState) || (pZip->m_zip_mode != MZ_ZIP_MODE_WRITING))
    return MZ_FALSE;
  if (NULL ==
      (pSrc_central_header = mz_zip_reader_get_cdh(pSource_zip, file_index)))
    return MZ_FALSE;
  pState = pZip->m_pState;

  num_alignment_padding_bytes =
      mz_zip_writer_compute_padding_needed_for_file_alignment(pZip);

  // no zip64 support yet
  if ((pZip->m_total_files == 0xFFFF) ||
      ((pZip->m_archive_size + num_alignment_padding_bytes +
        MZ_ZIP_LOCAL_DIR_HEADER_SIZE + MZ_ZIP_CENTRAL_DIR_HEADER_SIZE) >
       0xFFFFFFFF))
    return MZ_FALSE;

  cur_src_file_ofs =
      MZ_READ_LE32(pSrc_central_header + MZ_ZIP_CDH_LOCAL_HEADER_OFS);
  cur_dst_file_ofs = pZip->m_archive_size;

  if (pSource_zip->m_pRead(pSource_zip->m_pIO_opaque, cur_src_file_ofs,
                           pLocal_header, MZ_ZIP_LOCAL_DIR_HEADER_SIZE) !=
      MZ_ZIP_LOCAL_DIR_HEADER_SIZE)
    return MZ_FALSE;
  if (MZ_READ_LE32(pLocal_header) != MZ_ZIP_LOCAL_DIR_HEADER_SIG)
    return MZ_FALSE;
  cur_src_file_ofs += MZ_ZIP_LOCAL_DIR_HEADER_SIZE;

  if (!mz_zip_writer_write_zeros(pZip, cur_dst_file_ofs,
                                 num_alignment_padding_bytes))
    return MZ_FALSE;
  cur_dst_file_ofs += num_alignment_padding_bytes;
  local_dir_header_ofs = cur_dst_file_ofs;
  if (pZip->m_file_offset_alignment) {
    MZ_ASSERT((local_dir_header_ofs & (pZip->m_file_offset_alignment - 1)) ==
              0);
  }

  if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_dst_file_ofs, pLocal_header,
                     MZ_ZIP_LOCAL_DIR_HEADER_SIZE) !=
      MZ_ZIP_LOCAL_DIR_HEADER_SIZE)
    return MZ_FALSE;
  cur_dst_file_ofs += MZ_ZIP_LOCAL_DIR_HEADER_SIZE;

  n = MZ_READ_LE16(pLocal_header + MZ_ZIP_LDH_FILENAME_LEN_OFS) +
      MZ_READ_LE16(pLocal_header + MZ_ZIP_LDH_EXTRA_LEN_OFS);
  comp_bytes_remaining =
      n + MZ_READ_LE32(pSrc_central_header + MZ_ZIP_CDH_COMPRESSED_SIZE_OFS);

  if (NULL == (pBuf = pZip->m_pAlloc(
                   pZip->m_pAlloc_opaque, 1,
                   (size_t)MZ_MAX(sizeof(mz_uint32) * 4,
                                  MZ_MIN((mz_uint)MZ_ZIP_MAX_IO_BUF_SIZE,
                                         comp_bytes_remaining)))))
    return MZ_FALSE;

  while (comp_bytes_remaining) {
    n = (mz_uint)MZ_MIN((mz_uint)MZ_ZIP_MAX_IO_BUF_SIZE, comp_bytes_remaining);
    if (pSource_zip->m_pRead(pSource_zip->m_pIO_opaque, cur_src_file_ofs, pBuf,
                             n) != n) {
      pZip->m_pFree(pZip->m_pAlloc_opaque, pBuf);
      return MZ_FALSE;
    }
    cur_src_file_ofs += n;

    if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_dst_file_ofs, pBuf, n) != n) {
      pZip->m_pFree(pZip->m_pAlloc_opaque, pBuf);
      return MZ_FALSE;
    }
    cur_dst_file_ofs += n;

    comp_bytes_remaining -= n;
  }

  bit_flags = MZ_READ_LE16(pLocal_header + MZ_ZIP_LDH_BIT_FLAG_OFS);
  if (bit_flags & 8) {
    // Copy data descriptor
    if (pSource_zip->m_pRead(pSource_zip->m_pIO_opaque, cur_src_file_ofs, pBuf,
                             sizeof(mz_uint32) * 4) != sizeof(mz_uint32) * 4) {
      pZip->m_pFree(pZip->m_pAlloc_opaque, pBuf);
      return MZ_FALSE;
    }

    n = sizeof(mz_uint32) * ((MZ_READ_LE32(pBuf) == 0x08074b50) ? 4 : 3);
    if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_dst_file_ofs, pBuf, n) != n) {
      pZip->m_pFree(pZip->m_pAlloc_opaque, pBuf);
      return MZ_FALSE;
    }

    cur_src_file_ofs += n;
    cur_dst_file_ofs += n;
  }
  pZip->m_pFree(pZip->m_pAlloc_opaque, pBuf);

  // no zip64 support yet
  if (cur_dst_file_ofs > 0xFFFFFFFF) return MZ_FALSE;

  orig_central_dir_size = pState->m_central_dir.m_size;

  memcpy(central_header, pSrc_central_header, MZ_ZIP_CENTRAL_DIR_HEADER_SIZE);
  MZ_WRITE_LE32(central_header + MZ_ZIP_CDH_LOCAL_HEADER_OFS,
                local_dir_header_ofs);
  if (!mz_zip_array_push_back(pZip, &pState->m_central_dir, central_header,
                              MZ_ZIP_CENTRAL_DIR_HEADER_SIZE))
    return MZ_FALSE;

  n = MZ_READ_LE16(pSrc_central_header + MZ_ZIP_CDH_FILENAME_LEN_OFS) +
      MZ_READ_LE16(pSrc_central_header + MZ_ZIP_CDH_EXTRA_LEN_OFS) +
      MZ_READ_LE16(pSrc_central_header + MZ_ZIP_CDH_COMMENT_LEN_OFS);
  if (!mz_zip_array_push_back(
          pZip, &pState->m_central_dir,
          pSrc_central_header + MZ_ZIP_CENTRAL_DIR_HEADER_SIZE, n)) {
    mz_zip_array_resize(pZip, &pState->m_central_dir, orig_central_dir_size,
                        MZ_FALSE);
    return MZ_FALSE;
  }

  if (pState->m_central_dir.m_size > 0xFFFFFFFF) return MZ_FALSE;
  n = (mz_uint32)orig_central_dir_size;
  if (!mz_zip_array_push_back(pZip, &pState->m_central_dir_offsets, &n, 1)) {
    mz_zip_array_resize(pZip, &pState->m_central_dir, orig_central_dir_size,
                        MZ_FALSE);
    return MZ_FALSE;
  }

  pZip->m_total_files++;
  pZip->m_archive_size = cur_dst_file_ofs;

  return MZ_TRUE;
}